

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O3

int nn_setsockopt(int s,int level,int option,void *optval,size_t optvallen)

{
  int iVar1;
  int *piVar2;
  nn_sock *sock;
  nn_sock *local_30;
  
  iVar1 = nn_global_hold_socket(&local_30,s);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  else {
    if (optval == (void *)0x0 && optvallen != 0) {
      iVar1 = -0xe;
    }
    else {
      iVar1 = nn_sock_setopt(local_30,level,option,optval,optvallen);
      if (-1 < iVar1) {
        if (iVar1 == 0) {
          nn_mutex_lock(&self.lock);
          nn_sock_rele(local_30);
          nn_mutex_unlock(&self.lock);
          return 0;
        }
        nn_setsockopt_cold_1();
      }
    }
    nn_global_rele_socket(local_30);
    piVar2 = __errno_location();
    *piVar2 = -iVar1;
  }
  return -1;
}

Assistant:

int nn_setsockopt (int s, int level, int option, const void *optval,
    size_t optvallen)
{
    int rc;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!optval && optvallen)) {
        rc = -EFAULT;
        goto fail;
    }

    rc = nn_sock_setopt (sock, level, option, optval, optvallen);
    if (nn_slow (rc < 0))
        goto fail;
    errnum_assert (rc == 0, -rc);
    nn_global_rele_socket (sock);
    return 0;

fail:
    nn_global_rele_socket (sock);
    errno = -rc;
    return -1;
}